

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall wasm::DataFlow::Trace::findExternalUses(Trace *this)

{
  pointer *this_00;
  Expression *origin_00;
  pointer ppEVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  pointer ppNVar5;
  __node_base_ptr p_Var6;
  pointer ppNVar7;
  Node **node;
  undefined1 local_d0 [8];
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  origins;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> uses;
  Expression *origin;
  Expression *pEStack_50;
  Trace *local_48;
  pointer local_40;
  _Insert_base<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  local_d0 = (undefined1  [8])&origins._M_h._M_rehash_policy._M_next_resize;
  origins._M_h._M_buckets = (__buckets_ptr)0x1;
  origins._M_h._M_bucket_count = 0;
  origins._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  origins._M_h._M_element_count._0_4_ = 0x3f800000;
  origins._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  origins._M_h._M_rehash_policy._4_4_ = 0;
  origins._M_h._M_rehash_policy._M_next_resize = 0;
  ppNVar5 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar7 = (this->nodes).
                 super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar7 != ppNVar5;
      ppNVar7 = ppNVar7 + 1) {
    uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(*ppNVar7)->origin;
    if ((Expression *)
        uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (Expression *)0x0) {
      iVar2 = debug();
      if (1 < iVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"note origin ");
        poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
        std::operator<<(poVar3,'\n');
      }
      std::__detail::
      _Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_d0,
               (value_type *)
               &uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  ppNVar7 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar5 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_38 = (_Insert_base<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->hasExternalUses;
  this_00 = &uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48 = this;
  local_40 = ppNVar5;
  do {
    if (ppNVar7 == ppNVar5) {
      std::
      _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_d0);
      return;
    }
    if ((*ppNVar7 != this->toInfer) &&
       (origin_00 = (*ppNVar7)->origin, origin_00 != (Expression *)0x0)) {
      uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &pEStack_50;
      pEStack_50 = (Expression *)0x0;
      UseFinder::getUses((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &origins._M_h._M_single_bucket,(UseFinder *)this_00,origin_00,this->graph,
                         this->localGraph);
      std::
      _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)this_00);
      ppEVar1 = uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (p_Var6 = origins._M_h._M_single_bucket; p_Var6 != (__node_base_ptr)ppEVar1;
          p_Var6 = p_Var6 + 1) {
        uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)p_Var6->_M_nxt;
        if ((_Hash_node_base *)
            uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage == (_Hash_node_base *)0x0) {
LAB_00bd674b:
          iVar2 = debug();
          if (1 < iVar2) {
            std::operator<<((ostream *)&std::cout,"found external use for\n");
            DataFlow::dump(*ppNVar7,(ostream *)&std::cout,0);
            poVar3 = std::operator<<((ostream *)&std::cout,"  due to ");
            poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
            std::operator<<(poVar3,'\n');
          }
          std::__detail::
          _Insert_base<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert(local_38,ppNVar7);
          break;
        }
        sVar4 = std::
                _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_d0,(key_type *)this_00);
        if (sVar4 == 0) goto LAB_00bd674b;
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 &origins._M_h._M_single_bucket);
      ppNVar5 = local_40;
      this = local_48;
    }
    ppNVar7 = ppNVar7 + 1;
  } while( true );
}

Assistant:

void findExternalUses() {
    // Find all the wasm code represented in this trace.
    std::unordered_set<Expression*> origins;
    for (auto& node : nodes) {
      if (auto* origin = node->origin) {
        if (debug() >= 2) {
          std::cout << "note origin " << origin << '\n';
        }
        origins.insert(origin);
      }
    }
    for (auto& node : nodes) {
      if (node == toInfer) {
        continue;
      }
      if (auto* origin = node->origin) {
        auto uses = UseFinder().getUses(origin, graph, localGraph);
        for (auto* use : uses) {
          // A non-set use (a drop or return etc.) is definitely external.
          // Otherwise, check if internal or external.
          if (use == nullptr || origins.count(use) == 0) {
            if (debug() >= 2) {
              std::cout << "found external use for\n";
              dump(node, std::cout);
              std::cout << "  due to " << use << '\n';
            }
            hasExternalUses.insert(node);
            break;
          }
        }
      }
    }
  }